

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_synth.cpp
# Opt level: O2

bool append_descriptor(vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                       *bindings,vector<unsigned_int,_std::allocator<unsigned_int>_> *binding_flags,
                      uint32_t desc_set,uint32_t binding,VkDescriptorType desc_type,spvc_type type)

{
  VkDescriptorType VVar1;
  pointer pVVar2;
  spvc_bool sVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  char *__format;
  pointer pVVar7;
  ulong uVar8;
  pointer pVVar9;
  uint local_4c;
  value_type local_48;
  
  if (7 < desc_set) {
    fprintf(_stderr,"Fossilize ERROR: Descriptor set %u is out of range.\n");
    goto LAB_0010eada;
  }
  pVVar7 = bindings[desc_set].
           super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = bindings[desc_set].
           super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pVVar2 - (long)pVVar7;
  for (lVar5 = lVar6 / 0x18 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    pVVar9 = pVVar7;
    if (pVVar7->binding == binding) goto LAB_0010e9b0;
    if (pVVar7[1].binding == binding) {
      pVVar9 = pVVar7 + 1;
      goto LAB_0010e9b0;
    }
    if (pVVar7[2].binding == binding) {
      pVVar9 = pVVar7 + 2;
      goto LAB_0010e9b0;
    }
    if (pVVar7[3].binding == binding) {
      pVVar9 = pVVar7 + 3;
      goto LAB_0010e9b0;
    }
    pVVar7 = pVVar7 + 4;
    lVar6 = lVar6 + -0x60;
  }
  lVar6 = lVar6 / 0x18;
  if (lVar6 == 1) {
LAB_0010eaaa:
    pVVar9 = pVVar2;
    if (pVVar7->binding == binding) {
      pVVar9 = pVVar7;
    }
  }
  else if (lVar6 == 2) {
LAB_0010e986:
    pVVar9 = pVVar7;
    if (pVVar7->binding != binding) {
      pVVar7 = pVVar7 + 1;
      goto LAB_0010eaaa;
    }
  }
  else {
    pVVar9 = pVVar2;
    if ((lVar6 == 3) && (pVVar9 = pVVar7, pVVar7->binding != binding)) {
      pVVar7 = pVVar7 + 1;
      goto LAB_0010e986;
    }
  }
LAB_0010e9b0:
  uVar4 = spvc_type_get_num_array_dimensions(type);
  if (uVar4 == 1) {
    sVar3 = spvc_type_array_dimension_is_literal(type,0);
    if (sVar3 == '\0') {
      fwrite("Fossilize ERROR: Array size dimensions of resources must be constant literals.\n",0x4f
             ,1,_stderr);
      fflush(_stderr);
      return false;
    }
    uVar4 = spvc_type_get_array_dimension(type,0);
  }
  else {
    uVar4 = 1;
  }
  if (pVVar9 == bindings[desc_set].
                super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_48.pImmutableSamplers = (VkSampler *)0x0;
    local_48.stageFlags = 0x7fffffff;
    local_48.descriptorCount = 1000000;
    if (uVar4 != 0) {
      local_48.descriptorCount = uVar4;
    }
    local_48.binding = binding;
    local_48.descriptorType = desc_type;
    std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::
    push_back(bindings + desc_set,&local_48);
    local_4c = (uint)(uVar4 == 0) << 3;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (binding_flags + desc_set,&local_4c);
    return true;
  }
  VVar1 = pVVar9->descriptorType;
  if (VVar1 == desc_type) {
    uVar8 = 1000000;
    if (uVar4 != 0) {
      uVar8 = (ulong)uVar4;
    }
    VVar1 = pVVar9->descriptorCount;
    if (VVar1 == (VkDescriptorType)uVar8) {
      return true;
    }
    __format = "Fossilize ERROR: Descriptor count mismatch for (%u, %u) (was %u, now %u).\n";
  }
  else {
    __format = 
    "Fossilize ERROR: Overlap in descriptor type for binding (%u, %u) (was %u, now %u).\n";
    uVar8 = (ulong)desc_type;
  }
  fprintf(_stderr,__format,(ulong)desc_set,(ulong)binding,(ulong)VVar1,uVar8);
LAB_0010eada:
  fflush(_stderr);
  return false;
}

Assistant:

static bool append_descriptor(std::vector<VkDescriptorSetLayoutBinding> *bindings,
                              std::vector<VkDescriptorBindingFlags> *binding_flags,
                              uint32_t desc_set, uint32_t binding,
                              VkDescriptorType desc_type, spvc_type type)
{
	if (desc_set >= 8)
	{
		LOGE("Descriptor set %u is out of range.\n", desc_set);
		return false;
	}

	auto &binds = bindings[desc_set];

	auto itr = std::find_if(binds.begin(), binds.end(), [&](const VkDescriptorSetLayoutBinding &bind) {
		return bind.binding == binding;
	});

	unsigned num_array_dimensions = spvc_type_get_num_array_dimensions(type);
	uint32_t desc_count = 1;
	if (num_array_dimensions == 1)
	{
		if (!spvc_type_array_dimension_is_literal(type, 0))
		{
			LOGE("Array size dimensions of resources must be constant literals.\n");
			return false;
		}
		desc_count = spvc_type_get_array_dimension(type, 0);
	}

	if (itr != binds.end())
	{
		if (itr->descriptorType != desc_type)
		{
			LOGE("Overlap in descriptor type for binding (%u, %u) (was %u, now %u).\n",
			     desc_set, binding, itr->descriptorType, desc_type);
			return false;
		}

		if (desc_count == 0)
			desc_count = 1000000;

		if (itr->descriptorCount != desc_count)
		{
			LOGE("Descriptor count mismatch for (%u, %u) (was %u, now %u).\n",
			     desc_set, binding, itr->descriptorCount, desc_count);
			return false;
		}
	}
	else
	{
		VkDescriptorSetLayoutBinding bind = {};
		bind.binding = binding;
		bind.stageFlags = VK_SHADER_STAGE_ALL;
		bind.descriptorType = desc_type;
		bind.descriptorCount = desc_count != 0 ? desc_count : 1000000;
		binds.push_back(bind);
		binding_flags[desc_set].push_back(desc_count == 0 ? VK_DESCRIPTOR_BINDING_VARIABLE_DESCRIPTOR_COUNT_BIT : 0);
	}

	return true;
}